

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_55dd6::SetSourceiv
          (anon_unknown_dwarf_55dd6 *this,ALsource *Source,ALCcontext *Context,SourceProp prop,
          span<const_int,_18446744073709551615UL> values)

{
  int *piVar1;
  mutex *__mutex;
  uint uVar2;
  ALCdevice *device;
  undefined8 *ptr;
  byte bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ALeffectslot *pAVar7;
  ALbuffer *pAVar8;
  ALfilter *pAVar9;
  undefined8 *puVar10;
  undefined4 in_register_0000000c;
  uint *puVar11;
  ulong uVar12;
  Voice *pVVar13;
  size_t size;
  pointer piVar14;
  float *pfVar15;
  undefined8 uVar16;
  pointer pfVar17;
  unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> temp;
  ALCcontext *Context_00;
  uint uVar18;
  ALuint id;
  char *pcVar19;
  ALenum AVar20;
  span<const_float,_18446744073709551615UL> values_00;
  unique_lock<std::mutex> slotlock;
  optional<(anonymous_namespace)::VoicePos> vpos;
  unique_lock<std::mutex> local_90;
  undefined1 local_80 [16];
  undefined8 uStack_70;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  float local_50 [2];
  optional<(anonymous_namespace)::VoicePos> local_48;
  
  puVar11 = (uint *)CONCAT44(in_register_0000000c,prop);
  pfVar17 = (pointer)values.mDataEnd;
  piVar14 = values.mData;
  iVar5 = (int)Context;
  Context_00 = (ALCcontext *)((ulong)Context & 0xffffffff);
  device = *(ALCdevice **)&Source[1].mDistanceModel;
  local_90._M_device = (mutex_type *)0x0;
  local_90._M_owns = false;
  if (0x1211 < iVar5) {
    if (iVar5 < 0xd000) {
      if (iVar5 == 0x1212) {
        pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
        if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
          if (*puVar11 < 7) {
            *(uint *)(this + 0x6c) = *puVar11;
            goto LAB_00124d88;
          }
          goto LAB_00124dba;
        }
        uVar16 = 1;
        Context_00 = (ALCcontext *)0x1212;
      }
      else {
        if (iVar5 != 0x1214) {
          if (iVar5 != 0xc000) goto switchD_001244e3_caseD_1008;
          goto switchD_001244e3_caseD_1001;
        }
        pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
        if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
          uVar2 = *puVar11;
          uVar18 = uVar2;
          if (2 < uVar2) {
            if ((int)gLogLevel < 2) {
              uVar18 = 0;
            }
            else {
              fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Unsupported spatialize mode: 0x%04x\n",
                      (ulong)uVar2);
              uVar18 = 0;
            }
          }
          if (uVar2 < 3) {
            this[0x71] = SUB41(uVar18,0);
            bVar3 = 1;
            UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
            goto LAB_00124d93;
          }
          Context_00 = (ALCcontext *)(ulong)*puVar11;
          pcVar19 = "Unsupported AL_SOURCE_SPATIALIZE_SOFT: 0x%04x\n";
          goto LAB_00124d3b;
        }
        uVar16 = 1;
        Context_00 = (ALCcontext *)0x1214;
      }
    }
    else {
      switch(iVar5) {
      case 0x20005:
        pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
        if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
          if (*puVar11 == 0) {
            *(undefined8 *)(this + 0x94) = 0x3f8000003f800000;
            *(undefined8 *)(this + 0x9c) = 0x3f800000459c4000;
            *(undefined4 *)(this + 0xa4) = 0x437a0000;
          }
          else {
            iVar5 = pthread_mutex_lock((pthread_mutex_t *)&device->FilterLock);
            if (iVar5 != 0) {
              std::__throw_system_error(iVar5);
            }
            uVar2 = *puVar11;
            pAVar9 = LookupFilter(device,uVar2);
            if (pAVar9 == (ALfilter *)0x0) {
              ALCcontext::setError((ALCcontext *)Source,0xa003,"Invalid filter ID %u",(ulong)uVar2);
            }
            else {
              uVar16 = *(undefined8 *)&pAVar9->HFReference;
              *(undefined8 *)(this + 0x94) = *(undefined8 *)&pAVar9->Gain;
              *(undefined8 *)(this + 0x9c) = uVar16;
              *(float *)(this + 0xa4) = pAVar9->LFReference;
            }
            pthread_mutex_unlock((pthread_mutex_t *)&device->FilterLock);
            if (pAVar9 == (ALfilter *)0x0) goto LAB_00124fce;
          }
LAB_00124d88:
          bVar3 = 1;
          UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
          goto LAB_00124d93;
        }
        uVar16 = 1;
        Context_00 = (ALCcontext *)0x20005;
        break;
      case 0x20006:
        pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
        if ((pfVar17 == (pointer)0x3) || (pfVar17 == (pointer)0x6)) {
          local_80._0_8_ = &Source->DirectChannels;
          local_80._8_8_ = local_80._8_8_ & 0xffffffffffffff00;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_80);
          local_80[8] = 1;
          std::unique_lock<std::mutex>::operator=(&local_90,(unique_lock<std::mutex> *)local_80);
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_80);
          uVar2 = *puVar11;
          Context_00 = (ALCcontext *)(ulong)uVar2;
          if (uVar2 == 0) {
            pAVar7 = (ALeffectslot *)0x0;
          }
          else {
            pAVar7 = LookupEffectSlot((ALCcontext *)Source,uVar2);
            if (pAVar7 == (ALeffectslot *)0x0) {
              pcVar19 = "Invalid effect ID %u";
              goto LAB_00124d3b;
            }
          }
          Context_00 = (ALCcontext *)(ulong)puVar11[1];
          if (device->NumAuxSends <= puVar11[1]) {
            pcVar19 = "Invalid send %u";
LAB_00124d3b:
            AVar20 = 0xa003;
            goto LAB_00124d41;
          }
          if (puVar11[2] == 0) {
            *(undefined8 *)(this + (long)Context_00 * 0x20 + 0xb0) = 0x3f8000003f800000;
            *(undefined8 *)(this + (long)Context_00 * 0x20 + 0xb0 + 8) = 0x3f800000459c4000;
            *(undefined4 *)(this + (long)Context_00 * 0x20 + 0xc0) = 0x437a0000;
          }
          else {
            iVar5 = pthread_mutex_lock((pthread_mutex_t *)&device->FilterLock);
            if (iVar5 != 0) {
              std::__throw_system_error(iVar5);
            }
            uVar2 = puVar11[2];
            pAVar9 = LookupFilter(device,uVar2);
            if (pAVar9 == (ALfilter *)0x0) {
              ALCcontext::setError((ALCcontext *)Source,0xa003,"Invalid filter ID %u",(ulong)uVar2);
            }
            else {
              uVar2 = puVar11[1];
              uVar16 = *(undefined8 *)&pAVar9->HFReference;
              *(undefined8 *)(this + (ulong)uVar2 * 0x20 + 0xb0) = *(undefined8 *)&pAVar9->Gain;
              *(undefined8 *)(this + (ulong)uVar2 * 0x20 + 0xb0 + 8) = uVar16;
              *(float *)(this + (ulong)uVar2 * 0x20 + 0xc0) = pAVar9->LFReference;
            }
            pthread_mutex_unlock((pthread_mutex_t *)&device->FilterLock);
            if (pAVar9 == (ALfilter *)0x0) goto LAB_00124fce;
          }
          if ((pAVar7 != *(ALeffectslot **)(this + (ulong)puVar11[1] * 0x20 + 0xa8)) &&
             ((*(uint *)(this + 0x178) & 0xfffffffe) == 0x1012)) {
            if (pAVar7 != (ALeffectslot *)0x0) {
              LOCK();
              (pAVar7->ref).super___atomic_base<unsigned_int>._M_i =
                   (pAVar7->ref).super___atomic_base<unsigned_int>._M_i + 1;
              UNLOCK();
            }
            if (*(long *)(this + (ulong)puVar11[1] * 0x20 + 0xa8) != 0) {
              LOCK();
              piVar1 = (int *)(*(long *)(this + (ulong)puVar11[1] * 0x20 + 0xa8) + 0x98);
              *piVar1 = *piVar1 + -1;
              UNLOCK();
            }
            *(ALeffectslot **)(this + (ulong)puVar11[1] * 0x20 + 0xa8) = pAVar7;
            if ((*(ulong *)&(Source->Send)._M_elems[5].LFReference <= (ulong)*(uint *)(this + 0x18c)
                ) || (pVVar13 = *(Voice **)
                                 (*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                                 (ulong)*(uint *)(this + 0x18c) * 8),
                     (pVVar13->mSourceID).super___atomic_base<unsigned_int>._M_i !=
                     *(__int_type *)(this + 400))) {
              *(undefined4 *)(this + 0x18c) = 0xffffffff;
              pVVar13 = (Voice *)0x0;
            }
            if (pVVar13 != (Voice *)0x0) {
              bVar3 = 1;
              UpdateSourceProps((ALsource *)this,pVVar13,(ALCcontext *)Source);
              goto LAB_00124d93;
            }
            this[0x188] = (anon_unknown_dwarf_55dd6)0x0;
            goto LAB_00124d2f;
          }
          if (pAVar7 != (ALeffectslot *)0x0) {
            LOCK();
            (pAVar7->ref).super___atomic_base<unsigned_int>._M_i =
                 (pAVar7->ref).super___atomic_base<unsigned_int>._M_i + 1;
            UNLOCK();
          }
          if (*(long *)(this + (ulong)puVar11[1] * 0x20 + 0xa8) != 0) {
            LOCK();
            piVar1 = (int *)(*(long *)(this + (ulong)puVar11[1] * 0x20 + 0xa8) + 0x98);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          *(ALeffectslot **)(this + (ulong)puVar11[1] * 0x20 + 0xa8) = pAVar7;
          goto LAB_00124d88;
        }
        uVar16 = 3;
        Context_00 = (ALCcontext *)0x20006;
        break;
      case 0x20007:
      case 0x20008:
      case 0x20009:
        goto switchD_001244e3_caseD_1001;
      case 0x2000a:
        pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
        if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
          if (1 < *puVar11) goto LAB_00124dba;
          this[0x72] = SUB41(*puVar11,0);
          goto LAB_00124d88;
        }
        uVar16 = 1;
        Context_00 = (ALCcontext *)0x2000a;
        break;
      case 0x2000b:
        pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
        if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
          if (1 < *puVar11) goto LAB_00124dba;
          this[0x73] = SUB41(*puVar11,0);
          goto LAB_00124d88;
        }
        uVar16 = 1;
        Context_00 = (ALCcontext *)0x2000b;
        break;
      case 0x2000c:
        pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
        if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
          if (1 < *puVar11) goto LAB_00124dba;
          this[0x74] = SUB41(*puVar11,0);
          goto LAB_00124d88;
        }
        uVar16 = 1;
        Context_00 = (ALCcontext *)0x2000c;
        break;
      default:
        if (iVar5 == 0xd000) goto LAB_00124c57;
        goto switchD_001244e3_caseD_1008;
      }
    }
    goto LAB_00124be7;
  }
  switch(iVar5) {
  case 0x1001:
  case 0x1002:
  case 0x1003:
  case 0x100a:
  case 0x100d:
  case 0x100e:
  case 0x1020:
  case 0x1021:
  case 0x1022:
  case 0x1023:
  case 0x1031:
switchD_001244e3_caseD_1001:
    pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
    if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
      pfVar15 = (float *)((long)&local_68 + 4);
      uVar2 = *puVar11;
LAB_00124509:
      pfVar15[-1] = (float)(int)uVar2;
LAB_0012450f:
      values_00.mDataEnd = pfVar17;
      values_00.mData = pfVar15;
      bVar3 = SetSourcefv(this,Source,Context_00,(SourceProp)&local_68,values_00);
      goto LAB_00124d93;
    }
    goto LAB_00125022;
  case 0x1004:
  case 0x1005:
  case 0x1006:
    pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
    if ((pfVar17 == (pointer)0x3) || (pfVar17 == (pointer)0x6)) {
      pfVar15 = &fStack_5c;
      local_68 = CONCAT44((float)(int)((ulong)*(undefined8 *)puVar11 >> 0x20),
                          (float)(int)*(undefined8 *)puVar11);
      uVar2 = puVar11[2];
      goto LAB_00124509;
    }
    uVar16 = 3;
    break;
  case 0x1007:
    pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
    if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
      if (*puVar11 < 2) {
        this[0x65] = SUB41(*puVar11,0);
        bVar3 = 1;
        if ((*(uint *)(this + 0x178) & 0xfffffffe) == 0x1012) {
          if ((*(ulong *)&(Source->Send)._M_elems[5].LFReference <= (ulong)*(uint *)(this + 0x18c))
             || (lVar6 = *(long *)(*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                                  (ulong)*(uint *)(this + 0x18c) * 8),
                *(int *)(lVar6 + 0x170) != *(int *)(this + 400))) {
            *(undefined4 *)(this + 0x18c) = 0xffffffff;
            lVar6 = 0;
          }
          if (lVar6 != 0) {
            if (this[0x65] == (anon_unknown_dwarf_55dd6)0x1) {
              uVar16 = *(undefined8 *)(this + 0x180);
            }
            else {
              uVar16 = 0;
            }
            *(undefined8 *)(lVar6 + 400) = uVar16;
            do {
            } while (((device->MixCount).super___atomic_base<unsigned_int>._M_i & 1) != 0);
          }
        }
        goto LAB_00124d93;
      }
LAB_00124dba:
      bVar3 = 0;
      ALCcontext::setError((ALCcontext *)Source,0xa003,"Value out of range");
      goto LAB_00124d93;
    }
    uVar16 = 1;
    Context_00 = (ALCcontext *)0x1007;
    break;
  case 0x1008:
  case 0x100b:
  case 0x100c:
  case 0x1011:
  case 0x1012:
  case 0x1013:
  case 0x1014:
  case 0x1017:
  case 0x1018:
  case 0x1019:
  case 0x101a:
  case 0x101b:
  case 0x101c:
  case 0x101d:
  case 0x101e:
  case 0x101f:
  case 0x1028:
  case 0x1029:
  case 0x102a:
  case 0x102b:
  case 0x102c:
  case 0x102d:
  case 0x102e:
  case 0x102f:
  case 0x1030:
  case 0x1032:
switchD_001244e3_caseD_1008:
    pcVar19 = "Invalid source integer property 0x%04x";
    AVar20 = 0xa002;
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",Context_00);
    }
    goto LAB_00124d41;
  case 0x1009:
    pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
    if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
      if ((*(ulong *)&(Source->Send)._M_elems[5].LFReference <= (ulong)*(uint *)(this + 0x18c)) ||
         (lVar6 = *(long *)(*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                           (ulong)*(uint *)(this + 0x18c) * 8),
         *(int *)(lVar6 + 0x170) != *(int *)(this + 400))) {
        *(undefined4 *)(this + 0x18c) = 0xffffffff;
        lVar6 = 0;
      }
      if ((lVar6 == 0) && (*(int *)(this + 0x178) == 0x1012)) {
        *(undefined4 *)(this + 0x178) = 0x1014;
      }
      if ((*(uint *)(this + 0x178) & 0xfffffffe) == 0x1012) {
        bVar3 = 0;
        ALCcontext::setError
                  ((ALCcontext *)Source,0xa004,"Setting buffer on playing or paused source %u",
                   (ulong)*(uint *)(this + 400));
        goto LAB_00124d93;
      }
      ptr = *(undefined8 **)(this + 0x180);
      if (*puVar11 == 0) {
        *(undefined4 *)(this + 0x174) = 0x1030;
        *(undefined8 *)(this + 0x180) = 0;
LAB_00124cc1:
        bVar3 = 1;
        while (ptr != (undefined8 *)0x0) {
          puVar10 = (undefined8 *)*ptr;
          if (ptr[2] != 0) {
            LOCK();
            piVar1 = (int *)(ptr[2] + 0x70);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          al_free(ptr);
          ptr = puVar10;
        }
        goto LAB_00124d93;
      }
      __mutex = &device->BufferLock;
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar5 != 0) {
        std::__throw_system_error(iVar5);
      }
      id = *puVar11;
      size = (size_t)id;
      pAVar8 = LookupBuffer(device,id);
      if (pAVar8 == (ALbuffer *)0x0) {
        pcVar19 = "Invalid buffer ID %u";
        AVar20 = 0xa003;
      }
      else {
        if (pAVar8->MappedAccess == 0 || (pAVar8->MappedAccess & 4) != 0) {
          if (((pAVar8->mBuffer).mCallback == (CallbackType)0x0) ||
             ((pAVar8->ref).super___atomic_base<unsigned_int>._M_i == 0)) {
            puVar10 = (undefined8 *)BufferlistItem::operator_new((BufferlistItem *)0x18,size);
            *puVar10 = 0;
            *(undefined4 *)(puVar10 + 1) = 0;
            puVar10[2] = 0;
            *(uint *)(puVar10 + 1) = (pAVar8->mBuffer).mSampleLen;
            puVar10[2] = pAVar8;
            LOCK();
            (pAVar8->ref).super___atomic_base<unsigned_int>._M_i =
                 (pAVar8->ref).super___atomic_base<unsigned_int>._M_i + 1;
            UNLOCK();
            *(undefined4 *)(this + 0x174) = 0x1028;
            *(undefined8 **)(this + 0x180) = puVar10;
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            goto LAB_00124cc1;
          }
          pcVar19 = "Setting already-set callback buffer %u";
        }
        else {
          pcVar19 = "Setting non-persistently mapped buffer %u";
        }
        id = pAVar8->id;
        AVar20 = 0xa004;
      }
      ALCcontext::setError((ALCcontext *)Source,AVar20,pcVar19,(ulong)id);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
LAB_00124fce:
      bVar3 = 0;
      goto LAB_00124d93;
    }
    uVar16 = 1;
    Context_00 = (ALCcontext *)0x1009;
    break;
  case 0x100f:
    if ((long)piVar14 - (long)puVar11 == 0x18) {
      pfVar15 = local_50;
      fStack_60 = (float)(int)puVar11[2];
      fStack_5c = (float)(int)puVar11[3];
      local_68 = CONCAT44((float)(int)puVar11[1],(float)(int)*puVar11);
      local_58 = CONCAT44((float)(int)((ulong)*(undefined8 *)(puVar11 + 4) >> 0x20),
                          (float)(int)*(undefined8 *)(puVar11 + 4));
      Context_00 = (ALCcontext *)0x100f;
      goto LAB_0012450f;
    }
    pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
    uVar16 = 6;
    Context_00 = (ALCcontext *)0x100f;
    break;
  case 0x1010:
  case 0x1015:
  case 0x1016:
  case 0x1027:
    pcVar19 = "Setting read-only source property 0x%04x";
    AVar20 = 0xa004;
LAB_00124d41:
    bVar3 = 0;
    ALCcontext::setError((ALCcontext *)Source,AVar20,pcVar19,Context_00);
    goto LAB_00124d93;
  case 0x1024:
  case 0x1025:
  case 0x1026:
    uVar12 = (long)piVar14 - (long)puVar11;
    pfVar17 = (pointer)((long)uVar12 >> 2);
    if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
      if (-1 < (int)*puVar11) {
        if ((*(ulong *)&(Source->Send)._M_elems[5].LFReference <= (ulong)*(uint *)(this + 0x18c)) ||
           (pVVar13 = *(Voice **)
                       (*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                       (ulong)*(uint *)(this + 0x18c) * 8),
           (pVVar13->mSourceID).super___atomic_base<unsigned_int>._M_i !=
           *(__int_type *)(this + 400))) {
          *(undefined4 *)(this + 0x18c) = 0xffffffff;
          pVVar13 = (Voice *)0x0;
        }
        if (pVVar13 == (Voice *)0x0) {
          bVar4 = true;
        }
        else if ((pVVar13->mFlags & 2) == 0) {
          GetSampleOffset(&local_48,*(BufferlistItem **)(this + 0x180),iVar5,(double)(int)*puVar11);
          uVar16 = local_80._0_8_;
          local_80._0_8_ = local_80._0_8_ & 0xffffffffffffff00;
          local_80._8_8_ = 0;
          uStack_70 = 0;
          if (local_48.mHasValue == true) {
            local_80._12_4_ = local_48.field_1.mValue.frac;
            local_80._8_4_ = local_48.field_1.mValue.pos;
            uStack_70 = CONCAT44(local_48.field_1._12_4_,local_48.field_1._8_4_);
            local_80._1_7_ = SUB87(uVar16,1);
            local_80[0] = 1;
          }
          uVar12 = local_80._0_8_ & 0xff;
          if (local_80[0] == '\0') {
            bVar4 = false;
            ALCcontext::setError((ALCcontext *)Source,0xa003,"Invalid source offset");
          }
          else {
            bVar4 = SetVoiceOffset(pVVar13,(VoicePos *)(local_80 + 8),(ALsource *)this,
                                   (ALCcontext *)Source,device);
            bVar4 = !bVar4;
          }
        }
        else {
          bVar4 = false;
          ALCcontext::setError((ALCcontext *)Source,0xa003,"Source offset for callback is invalid");
          uVar12 = 0;
        }
        bVar3 = (byte)uVar12;
        if (!bVar4) goto LAB_00124d93;
        *(int *)(this + 0x170) = iVar5;
        *(double *)(this + 0x168) = (double)(int)*puVar11;
LAB_00124d2f:
        bVar3 = 1;
        goto LAB_00124d93;
      }
      goto LAB_00124dba;
    }
LAB_00125022:
    uVar16 = 1;
    break;
  case 0x1033:
    pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
    if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
      uVar2 = *puVar11;
      uVar18 = uVar2;
      if (2 < uVar2) {
        if ((int)gLogLevel < 2) {
          uVar18 = 0;
        }
        else {
          fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Unsupported direct mode: 0x%04x\n",(ulong)uVar2);
          uVar18 = 0;
        }
      }
      if (uVar2 < 3) {
        this[0x70] = SUB41(uVar18,0);
        bVar3 = 1;
        UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
        goto LAB_00124d93;
      }
      ALCcontext::setError
                ((ALCcontext *)Source,0xa003,"Unsupported AL_DIRECT_CHANNELS_SOFT: 0x%04x\n",
                 (ulong)*puVar11);
LAB_00124c57:
      pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
      if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
        uVar2 = *puVar11;
        if ((uVar2 - 0xd001 < 6) || (uVar2 == 0)) {
          *(uint *)(this + 0x68) = uVar2;
          bVar3 = 1;
          if (*(char *)&(Source->Direct).GainLF == '\0') goto LAB_00124d93;
          goto LAB_00124d88;
        }
        goto LAB_00124dba;
      }
      goto LAB_00125022;
    }
    uVar16 = 1;
    Context_00 = (ALCcontext *)0x1033;
    break;
  default:
    if (iVar5 != 0x202) goto switchD_001244e3_caseD_1008;
    pfVar17 = (pointer)((long)piVar14 - (long)puVar11 >> 2);
    if ((pfVar17 == (pointer)0x1) || (pfVar17 == (pointer)0x6)) {
      if (*puVar11 < 2) {
        this[100] = SUB41(*puVar11,0);
        goto LAB_00124d88;
      }
      goto LAB_00124dba;
    }
    uVar16 = 1;
    Context_00 = (ALCcontext *)0x202;
  }
LAB_00124be7:
  bVar3 = 0;
  ALCcontext::setError
            ((ALCcontext *)Source,0xa002,"Property 0x%04x expects %d value(s), got %zu",Context_00,
             uVar16,pfVar17);
LAB_00124d93:
  std::unique_lock<std::mutex>::~unique_lock(&local_90);
  return (bool)(bVar3 & 1);
}

Assistant:

bool SetSourceiv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<const int> values)
{
    ALCdevice *device{Context->mDevice.get()};
    ALeffectslot *slot{nullptr};
    BufferlistItem *oldlist{nullptr};
    std::unique_lock<std::mutex> slotlock;
    float fvals[6];

    switch(prop)
    {
    case AL_SOURCE_STATE:
    case AL_SOURCE_TYPE:
    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
        /* Query only */
        SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
            "Setting read-only source property 0x%04x", prop);

    case AL_SOURCE_RELATIVE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->HeadRelative = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_LOOPING:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->Looping = values[0] != AL_FALSE;
        if(IsPlayingOrPaused(Source))
        {
            if(Voice *voice{GetSourceVoice(Source, Context)})
            {
                if(Source->Looping)
                    voice->mLoopBuffer.store(Source->queue, std::memory_order_release);
                else
                    voice->mLoopBuffer.store(nullptr, std::memory_order_release);

                /* If the source is playing, wait for the current mix to finish
                 * to ensure it isn't currently looping back or reaching the
                 * end.
                 */
                device->waitForMix();
            }
        }
        return true;

    case AL_BUFFER:
        CHECKSIZE(values, 1);
        {
            const ALenum state{GetSourceState(Source, GetSourceVoice(Source, Context))};
            if(state == AL_PLAYING || state == AL_PAUSED)
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting buffer on playing or paused source %u", Source->id);
        }
        oldlist = Source->queue;
        if(values[0])
        {
            std::lock_guard<std::mutex> _{device->BufferLock};
            ALbuffer *buffer{LookupBuffer(device, static_cast<ALuint>(values[0]))};
            if(!buffer)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid buffer ID %u",
                    static_cast<ALuint>(values[0]));
            if(buffer->MappedAccess && !(buffer->MappedAccess&AL_MAP_PERSISTENT_BIT_SOFT))
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting non-persistently mapped buffer %u", buffer->id);
            if(buffer->mBuffer.mCallback && ReadRef(buffer->ref) != 0)
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting already-set callback buffer %u", buffer->id);

            /* Add the selected buffer to a one-item queue */
            auto newlist = new BufferlistItem{};
            newlist->mSampleLen = buffer->mBuffer.mSampleLen;
            newlist->mBuffer = &buffer->mBuffer;
            IncrementRef(buffer->ref);

            /* Source is now Static */
            Source->SourceType = AL_STATIC;
            Source->queue = newlist;
        }
        else
        {
            /* Source is now Undetermined */
            Source->SourceType = AL_UNDETERMINED;
            Source->queue = nullptr;
        }

        /* Delete all elements in the previous queue */
        while(oldlist != nullptr)
        {
            std::unique_ptr<BufferlistItem> temp{oldlist};
            oldlist = temp->mNext.load(std::memory_order_relaxed);

            if(BufferStorage *buffer{temp->mBuffer})
                DecrementRef(BufferFromStorage(buffer)->ref);
        }
        return true;

    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0);

        if(Voice *voice{GetSourceVoice(Source, Context)})
        {
            if((voice->mFlags&VoiceIsCallback))
                SETERR_RETURN(Context, AL_INVALID_VALUE, false,
                    "Source offset for callback is invalid");
            auto vpos = GetSampleOffset(Source->queue, prop, values[0]);
            if(!vpos) SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid source offset");

            if(SetVoiceOffset(voice, *vpos, Source, Context, device))
                return true;
        }
        Source->OffsetType = prop;
        Source->Offset = values[0];
        return true;

    case AL_DIRECT_FILTER:
        CHECKSIZE(values, 1);
        if(values[0])
        {
            std::lock_guard<std::mutex> _{device->FilterLock};
            ALfilter *filter{LookupFilter(device, static_cast<ALuint>(values[0]))};
            if(!filter)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid filter ID %u",
                    static_cast<ALuint>(values[0]));
            Source->Direct.Gain = filter->Gain;
            Source->Direct.GainHF = filter->GainHF;
            Source->Direct.HFReference = filter->HFReference;
            Source->Direct.GainLF = filter->GainLF;
            Source->Direct.LFReference = filter->LFReference;
        }
        else
        {
            Source->Direct.Gain = 1.0f;
            Source->Direct.GainHF = 1.0f;
            Source->Direct.HFReference = LOWPASSFREQREF;
            Source->Direct.GainLF = 1.0f;
            Source->Direct.LFReference = HIGHPASSFREQREF;
        }
        return UpdateSourceProps(Source, Context);

    case AL_DIRECT_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->DryGainHFAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->WetGainAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->WetGainHFAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_DIRECT_CHANNELS_SOFT:
        CHECKSIZE(values, 1);
        if(auto mode = DirectModeFromEnum(values[0]))
        {
            Source->DirectChannels = *mode;
            return UpdateSourceProps(Source, Context);
        }
        Context->setError(AL_INVALID_VALUE, "Unsupported AL_DIRECT_CHANNELS_SOFT: 0x%04x\n",
            values[0]);

    case AL_DISTANCE_MODEL:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_NONE ||
            values[0] == AL_INVERSE_DISTANCE || values[0] == AL_INVERSE_DISTANCE_CLAMPED ||
            values[0] == AL_LINEAR_DISTANCE || values[0] == AL_LINEAR_DISTANCE_CLAMPED ||
            values[0] == AL_EXPONENT_DISTANCE || values[0] == AL_EXPONENT_DISTANCE_CLAMPED);

        Source->mDistanceModel = static_cast<DistanceModel>(values[0]);
        if(Context->mSourceDistanceModel)
            return UpdateSourceProps(Source, Context);
        return true;

    case AL_SOURCE_RESAMPLER_SOFT:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0 && values[0] <= static_cast<int>(Resampler::Max));

        Source->mResampler = static_cast<Resampler>(values[0]);
        return UpdateSourceProps(Source, Context);

    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        if(auto mode = SpatializeModeFromEnum(values[0]))
        {
            Source->mSpatialize = *mode;
            return UpdateSourceProps(Source, Context);
        }
        Context->setError(AL_INVALID_VALUE, "Unsupported AL_SOURCE_SPATIALIZE_SOFT: 0x%04x\n",
            values[0]);
        return false;

    case AL_AUXILIARY_SEND_FILTER:
        CHECKSIZE(values, 3);
        slotlock = std::unique_lock<std::mutex>{Context->mEffectSlotLock};
        if(values[0] && (slot=LookupEffectSlot(Context, static_cast<ALuint>(values[0]))) == nullptr)
            SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid effect ID %u", values[0]);
        if(static_cast<ALuint>(values[1]) >= device->NumAuxSends)
            SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid send %u", values[1]);

        if(values[2])
        {
            std::lock_guard<std::mutex> _{device->FilterLock};
            ALfilter *filter{LookupFilter(device, static_cast<ALuint>(values[2]))};
            if(!filter)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid filter ID %u", values[2]);

            auto &send = Source->Send[static_cast<ALuint>(values[1])];
            send.Gain = filter->Gain;
            send.GainHF = filter->GainHF;
            send.HFReference = filter->HFReference;
            send.GainLF = filter->GainLF;
            send.LFReference = filter->LFReference;
        }
        else
        {
            /* Disable filter */
            auto &send = Source->Send[static_cast<ALuint>(values[1])];
            send.Gain = 1.0f;
            send.GainHF = 1.0f;
            send.HFReference = LOWPASSFREQREF;
            send.GainLF = 1.0f;
            send.LFReference = HIGHPASSFREQREF;
        }

        if(slot != Source->Send[static_cast<ALuint>(values[1])].Slot && IsPlayingOrPaused(Source))
        {
            /* Add refcount on the new slot, and release the previous slot */
            if(slot) IncrementRef(slot->ref);
            if(auto *oldslot = Source->Send[static_cast<ALuint>(values[1])].Slot)
                DecrementRef(oldslot->ref);
            Source->Send[static_cast<ALuint>(values[1])].Slot = slot;

            /* We must force an update if the auxiliary slot changed on an
             * active source, in case the slot is about to be deleted.
             */
            Voice *voice{GetSourceVoice(Source, Context)};
            if(voice) UpdateSourceProps(Source, voice, Context);
            else Source->PropsClean.clear(std::memory_order_release);
        }
        else
        {
            if(slot) IncrementRef(slot->ref);
            if(auto *oldslot = Source->Send[static_cast<ALuint>(values[1])].Slot)
                DecrementRef(oldslot->ref);
            Source->Send[static_cast<ALuint>(values[1])].Slot = slot;
            UpdateSourceProps(Source, Context);
        }
        return true;


    /* 1x float */
    case AL_CONE_INNER_ANGLE:
    case AL_CONE_OUTER_ANGLE:
    case AL_PITCH:
    case AL_GAIN:
    case AL_MIN_GAIN:
    case AL_MAX_GAIN:
    case AL_REFERENCE_DISTANCE:
    case AL_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAIN:
    case AL_MAX_DISTANCE:
    case AL_DOPPLER_FACTOR:
    case AL_CONE_OUTER_GAINHF:
    case AL_AIR_ABSORPTION_FACTOR:
    case AL_ROOM_ROLLOFF_FACTOR:
    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        fvals[0] = static_cast<float>(values[0]);
        return SetSourcefv(Source, Context, prop, {fvals, 1u});

    /* 3x float */
    case AL_POSITION:
    case AL_VELOCITY:
    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        return SetSourcefv(Source, Context, prop, {fvals, 3u});

    /* 6x float */
    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        fvals[3] = static_cast<float>(values[3]);
        fvals[4] = static_cast<float>(values[4]);
        fvals[5] = static_cast<float>(values[5]);
        return SetSourcefv(Source, Context, prop, {fvals, 6u});

    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
    case AL_STEREO_ANGLES:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source integer property 0x%04x", prop);
    return false;
}